

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alg.cpp
# Opt level: O2

double __thiscall Alg::effic_inf_valid_algo(Alg *this)

{
  double dVar1;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_28;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_28,&this->__vecSeed);
  dVar1 = effic_inf_valid_algo(this,(Nodelist *)&local_28);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_28);
  return dVar1;
}

Assistant:

double Alg::effic_inf_valid_algo()
{
    return effic_inf_valid_algo(__vecSeed);
}